

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.hpp
# Opt level: O2

any * __thiscall Json::operator[](Json *this,int index)

{
  bool bVar1;
  vector<std::any,_std::allocator<std::any>_> *pvVar2;
  undefined8 *puVar3;
  
  bVar1 = is_array(this);
  if (bVar1) {
    pvVar2 = std::any_cast<std::vector<std::any,std::allocator<std::any>>&>(&this->_data);
    return (pvVar2->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
           super__Vector_impl_data._M_start + index;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__bad_cast_0014cfe0;
  __cxa_throw(puVar3,&std::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

std::any &operator[](int index) {
        if (this->is_array()) {
            auto &data =
                    std::any_cast<std::vector<std::any> &>(_data);
            return data[index];
        } else {
            throw std::bad_any_cast();
        }
    }